

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ApprovalTestNamer::getRelativeTestSourceDirectory_abi_cxx11_
          (string *__return_storage_ptr__,ApprovalTestNamer *this)

{
  TestName *pTVar1;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pTVar1 = getCurrentTest();
  ::std::__cxx11::string::string((string *)&local_90,&pTVar1->originalFileName);
  FileUtils::getDirectory(__return_storage_ptr__,&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::string((string *)&local_30,__return_storage_ptr__);
  TestName::getRootDirectory_abi_cxx11_();
  ::std::__cxx11::string::string((string *)&local_70,"",&local_91);
  StringUtils::replaceAll((string *)&local_90,&local_30,&local_50,&local_70);
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalTestNamer::getRelativeTestSourceDirectory() const
    {
        // We are using the original directory - as obtained from __FILE__,
        // as this seems to be consistent for relative paths, regardless of
        // Ninja __FILE__ quirks
        auto originalDir =
            FileUtils::getDirectory(getCurrentTest().getOriginalFileName());
        originalDir =
            StringUtils::replaceAll(originalDir, TestName::getRootDirectory(), "");
        return originalDir;
    }